

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O0

PaError PaUtil_CancelThreading(PaUtilThreading *threading,int wait,PaError *exitResult)

{
  undefined4 *in_RDX;
  int in_ESI;
  pthread_t *in_RDI;
  void *pret;
  PaError result;
  undefined4 *local_28;
  PaError local_1c;
  undefined4 *local_18;
  pthread_t *local_8;
  
  local_1c = 0;
  if (in_RDX != (undefined4 *)0x0) {
    *in_RDX = 0;
  }
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (in_ESI == 0) {
    pthread_cancel(*in_RDI);
  }
  pthread_join(*local_8,&local_28);
  if ((local_28 != (undefined4 *)0x0) && (local_28 != (undefined4 *)0xffffffffffffffff)) {
    if (local_18 != (undefined4 *)0x0) {
      *local_18 = *local_28;
    }
    free(local_28);
  }
  return local_1c;
}

Assistant:

PaError PaUtil_CancelThreading( PaUtilThreading *threading, int wait, PaError *exitResult )
{
    PaError result = paNoError;
    void *pret;

    if( exitResult )
        *exitResult = paNoError;

    /* If pthread_cancel is not supported (Android platform) whole this function can lead to indefinite waiting if 
       working thread (callbackThread) has'n received any stop signals from outside, please keep 
       this in mind when considering using PaUtil_CancelThreading
    */
#ifdef PTHREAD_CANCELED
    /* Only kill the thread if it isn't in the process of stopping (flushing adaptation buffers) */
    if( !wait )
        pthread_cancel( threading->callbackThread );   /* XXX: Safe to call this if the thread has exited on its own? */
#endif
    pthread_join( threading->callbackThread, &pret );

#ifdef PTHREAD_CANCELED
    if( pret && PTHREAD_CANCELED != pret )
#else
    /* !wait means the thread may have been canceled */
    if( pret && wait )
#endif
    {
        if( exitResult )
            *exitResult = *(PaError *) pret;
        free( pret );
    }

    return result;
}